

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

void __thiscall
Lexer_MultiCharSymbols_Test::~Lexer_MultiCharSymbols_Test(Lexer_MultiCharSymbols_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Lexer, MultiCharSymbols) {
	MockLexer mock = mock_new("+= -= >= <= ..");
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_ADD_ASSIGN);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_SUB_ASSIGN);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_GE);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_LE);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_CONCAT);
	lex_next(&mock.lxr); ASSERT_EQ(mock.lxr.tk.type, TK_EOF);
	mock_free(&mock);
}